

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O3

void __thiscall S1ChordAngle::S1ChordAngle(S1ChordAngle *this,S1Angle angle)

{
  double dVar1;
  S2LogMessage SStack_18;
  
  if (0.0 <= angle.radians_) {
    dVar1 = INFINITY;
    if (angle.radians_ < INFINITY) {
      if (3.141592653589793 <= angle.radians_) {
        angle.radians_ = 3.141592653589793;
      }
      dVar1 = sin(angle.radians_ * 0.5);
      dVar1 = (dVar1 + dVar1) * (dVar1 + dVar1);
    }
  }
  else {
    dVar1 = -1.0;
  }
  this->length2_ = dVar1;
  if ((dVar1 != INFINITY &&
       (-1 < (long)dVar1 || 0x3fe < (uint)((long)ABS(dVar1) + 0xfff0000000000000U >> 0x35))) &&
     (4.0 < dVar1 || dVar1 < 0.0)) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
               ,0x30,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: is_valid() ",0x19);
    abort();
  }
  return;
}

Assistant:

S1ChordAngle::S1ChordAngle(S1Angle angle) {
  if (angle.radians() < 0) {
    *this = Negative();
  } else if (angle == S1Angle::Infinity()) {
    *this = Infinity();
  } else {
    // The chord length is 2 * sin(angle / 2).
    double length = 2 * sin(0.5 * min(M_PI, angle.radians()));
    length2_ = length * length;
  }
  S2_DCHECK(is_valid());
}